

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O1

shared_ptr<helics::Broker> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,string *name)

{
  _Base_ptr p_Var1;
  int iVar2;
  iterator iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  key_type *extraout_RDX;
  shared_ptr<helics::Broker> sVar4;
  
  if ((*(byte *)name[4]._M_string_length & 1) == 0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)name);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
                    *)&name[1]._M_string_length,(key_type *)in_RDX._M_pi);
    if (iVar3._M_node == (_Base_ptr)&name[1].field_2) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
    else {
      *(undefined8 *)this = *(undefined8 *)(iVar3._M_node + 2);
      p_Var1 = iVar3._M_node[2]._M_parent;
      *(_Base_ptr *)(this + 8) = p_Var1;
      if (p_Var1 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)name);
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<X> findObject(const std::string& name)
    {
#ifdef ENABLE_TRIPWIRE
        if (trippedDetect.isTripped()) {
            return nullptr;
        }
#endif
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = objectMap.find(name);
        if (fnd != objectMap.end()) {
            return fnd->second;
        }
        return nullptr;
    }